

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O2

unsigned_long
AdaptingInputOnlyProcess
          (PaUtilBufferProcessor *bp,int *streamCallbackResult,
          PaUtilChannelDescriptor *hostInputChannels,unsigned_long framesToProcess)

{
  uint uVar1;
  PaStreamCallbackTimeInfo *pPVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  uint uVar8;
  ulong uVar9;
  PaUtilChannelDescriptor *pPVar10;
  void **ppvVar11;
  ulong uVar12;
  unsigned_long uVar13;
  undefined1 auVar14 [16];
  uint local_6c;
  void **local_60;
  
  uVar4 = bp->framesPerUserBuffer;
  uVar6 = bp->framesInTempInputBuffer;
  uVar13 = 0;
  do {
    uVar7 = uVar4 - uVar6;
    if (uVar6 + framesToProcess <= uVar4) {
      uVar7 = framesToProcess;
    }
    ppvVar11 = (void **)bp->tempInputBuffer;
    uVar1 = bp->bytesPerUserInputSample;
    uVar12 = (ulong)uVar1;
    if (bp->userInputIsInterleaved == 0) {
      uVar5 = (ulong)bp->inputChannelCount;
      uVar8 = 0;
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        bp->tempInputBufferPtrs[uVar9] = (void *)(uVar8 * uVar4 + (long)bp->tempInputBuffer);
        uVar8 = uVar8 + uVar1;
      }
      uVar4 = (ulong)(uVar1 * (int)uVar4);
      local_60 = bp->tempInputBufferPtrs;
      local_6c = 1;
    }
    else {
      local_6c = bp->inputChannelCount;
      uVar5 = (ulong)local_6c;
      uVar4 = uVar12;
      uVar12 = (ulong)(local_6c * uVar1);
      local_60 = ppvVar11;
    }
    ppvVar11 = (void **)((long)ppvVar11 + uVar6 * uVar12);
    pPVar10 = hostInputChannels;
    for (uVar12 = 0; uVar12 < uVar5; uVar12 = uVar12 + 1) {
      (*bp->inputConverter)
                (ppvVar11,local_6c,pPVar10->data,pPVar10->stride,(uint)uVar7,&bp->ditherGenerator);
      pPVar10->data =
           (void *)((long)pPVar10->data +
                   (ulong)bp->bytesPerHostInputSample * pPVar10->stride * uVar7);
      ppvVar11 = (void **)((long)ppvVar11 + uVar4);
      uVar5 = (ulong)bp->inputChannelCount;
      pPVar10 = pPVar10 + 1;
    }
    uVar6 = bp->framesInTempInputBuffer + uVar7;
    bp->framesInTempInputBuffer = uVar6;
    uVar4 = bp->framesPerUserBuffer;
    if (uVar6 == uVar4) {
      uVar4 = uVar6;
      if (*streamCallbackResult == 0) {
        pPVar2 = bp->timeInfo;
        pPVar2->outputBufferDacTime = 0.0;
        iVar3 = (*bp->streamCallback)
                          (local_60,(void *)0x0,uVar6,pPVar2,bp->callbackStatusFlags,bp->userData);
        *streamCallbackResult = iVar3;
        uVar4 = bp->framesPerUserBuffer;
        auVar14._8_4_ = (int)(uVar4 >> 0x20);
        auVar14._0_8_ = uVar4;
        auVar14._12_4_ = 0x45300000;
        bp->timeInfo->inputBufferAdcTime =
             ((auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) * bp->samplePeriod +
             bp->timeInfo->inputBufferAdcTime;
      }
      bp->framesInTempInputBuffer = 0;
      uVar6 = 0;
    }
    uVar13 = uVar13 + uVar7;
    framesToProcess = framesToProcess - uVar7;
  } while (framesToProcess != 0);
  return uVar13;
}

Assistant:

static unsigned long AdaptingInputOnlyProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostInputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *destBytePtr;
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;
    
    userOutput = 0;

    do
    {
        frameCount = ( bp->framesInTempInputBuffer + framesToGo > bp->framesPerUserBuffer )
                ? ( bp->framesPerUserBuffer - bp->framesInTempInputBuffer )
                : framesToGo;

        /* convert frameCount samples into temp buffer */

        if( bp->userInputIsInterleaved )
        {
            destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                    bp->bytesPerUserInputSample * bp->inputChannelCount *
                    bp->framesInTempInputBuffer;
                      
            destSampleStrideSamples = bp->inputChannelCount;
            destChannelStrideBytes = bp->bytesPerUserInputSample;

            userInput = bp->tempInputBuffer;
        }
        else /* user input is not interleaved */
        {
            destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                    bp->bytesPerUserInputSample * bp->framesInTempInputBuffer;

            destSampleStrideSamples = 1;
            destChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserInputSample;

            /* setup non-interleaved ptrs */
            for( i=0; i<bp->inputChannelCount; ++i )
            {
                bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                    i * bp->bytesPerUserInputSample * bp->framesPerUserBuffer;
            }
                    
            userInput = bp->tempInputBufferPtrs;
        }

        for( i=0; i<bp->inputChannelCount; ++i )
        {
            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                    hostInputChannels[i].data,
                                    hostInputChannels[i].stride,
                                    frameCount, &bp->ditherGenerator );

            destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

            /* advance src ptr for next iteration */
            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
        }

        bp->framesInTempInputBuffer += frameCount;

        if( bp->framesInTempInputBuffer == bp->framesPerUserBuffer )
        {
            /**
            @todo (non-critical optimisation)
            The conditional below implements the continue/complete/abort mechanism
            simply by continuing on iterating through the input buffer, but not
            passing the data to the callback. With care, the outer loop could be
            terminated earlier, thus some unneeded conversion cycles would be
            saved.
            */
            if( *streamCallbackResult == paContinue )
            {
                bp->timeInfo->outputBufferDacTime = 0;

                *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                        bp->framesPerUserBuffer, bp->timeInfo,
                        bp->callbackStatusFlags, bp->userData );

                bp->timeInfo->inputBufferAdcTime += bp->framesPerUserBuffer * bp->samplePeriod;
            }
            
            bp->framesInTempInputBuffer = 0;
        }

        framesProcessed += frameCount;

        framesToGo -= frameCount;
    }while( framesToGo > 0 );

    return framesProcessed;
}